

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> __thiscall
duckdb::Binder::BindUnpivot
          (Binder *this,Binder *child_binder,PivotRef *ref,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *all_columns,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *where_clause)

{
  unsigned_long __val;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  pointer pPVar3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  pointer puVar6;
  pointer puVar7;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var8;
  pointer pcVar9;
  long lVar10;
  bool bVar11;
  pointer *ppbVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var13;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var14;
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> _Var15;
  reference pvVar16;
  char cVar17;
  SelectNode *pSVar18;
  pointer pSVar19;
  type pPVar20;
  reference pvVar21;
  pointer pPVar22;
  BaseExpression *this_00;
  ColumnRefExpression *pCVar23;
  string *__k;
  iterator __it;
  mapped_type *pmVar24;
  iterator iVar25;
  pointer pUVar26;
  reference pvVar27;
  reference __args;
  long *plVar28;
  ConstantExpression *this_01;
  pointer pCVar29;
  reference args_1;
  pointer pFVar30;
  pointer pSVar31;
  SubqueryRef *this_02;
  pointer pSVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  OperatorExpression *this_03;
  ConjunctionExpression *this_04;
  InternalException *pIVar35;
  BinderException *pBVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  long lVar38;
  pointer pUVar39;
  ulong __n;
  size_type __n_00;
  pointer *__ptr;
  UnpivotEntry *entry_1;
  size_type sVar40;
  size_type sVar41;
  char cVar42;
  Binder *this_05;
  pointer this_06;
  long *in_R9;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_07
  ;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_08;
  pointer __n_01;
  PivotColumnEntry *entry;
  pointer entry_00;
  size_type __n_02;
  unsigned_long uVar43;
  string generated_name;
  templated_unique_single_t *result_node;
  vector<duckdb::UnpivotEntry,_true> unpivot_entries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  result;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  unpivot_expressions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  select_names;
  vector<duckdb::Value,_true> unpivot_names;
  value_type unnest_name;
  Value unpivot_list;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unnest_val_children;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unnest_name_children;
  case_insensitive_set_t handled_columns;
  case_insensitive_map_t<string> name_map;
  UnpivotEntry local_338;
  TableRef *local_2e8;
  pointer local_2e0;
  __uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> local_2d8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_2d0;
  vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_> local_2c8;
  pointer local_2a8;
  pointer local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_298;
  long lStack_280;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
  local_278;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_258;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_250;
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_248;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_238;
  pointer local_220;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_218;
  long *local_210;
  pointer local_208;
  pointer pVStack_200;
  pointer local_1f8;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  Value local_1c8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_188;
  pointer local_168;
  reference local_160;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_158;
  vector<duckdb::Value,_true> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long local_f0;
  long lStack_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_2e8 = (TableRef *)all_columns;
  local_2d8._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
  super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl =
       (tuple<duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)
       (tuple<duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)this;
  pSVar18 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(pSVar18);
  local_2d0._M_head_impl = (QueryNode *)pSVar18;
  pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)&local_2d0);
  _Var1._M_head_impl = (TableRef *)local_2e8[1]._vptr_TableRef;
  local_2e8[1]._vptr_TableRef = (_func_int **)0x0;
  _Var2._M_head_impl =
       (pSVar19->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar19->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
  }
  this_05 = (Binder *)&local_2e8[1].query_location;
  local_160 = vector<duckdb::PivotColumn,_true>::operator[]
                        ((vector<duckdb::PivotColumn,_true> *)this_05,0);
  local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entry_00 = (local_160->entries).
             super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
             super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (local_160->entries).
           super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
           super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_2a8 = (pointer)where_clause;
  if (entry_00 != pPVar3) {
    local_210 = in_R9;
    do {
      ExtractUnpivotEntries
                (this_05,(Binder *)ref,entry_00,(vector<duckdb::UnpivotEntry,_true> *)&local_2c8);
      entry_00 = entry_00 + 1;
    } while (entry_00 != pPVar3);
    local_2a0 = local_2c8.
                super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_100._M_allocated_capacity = (size_type)&uStack_d0;
      local_100._8_8_ = 1;
      local_f0 = 0;
      lStack_e8 = 0;
      local_e0 = 0x3f800000;
      local_d8 = 0;
      uStack_d0 = 0;
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      pUVar26 = local_2c8.
                super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        this_07 = (pUVar26->expressions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (pUVar26->expressions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_2e0 = pUVar26;
        if (this_07 != puVar4) {
          do {
            local_298.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_298.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_298.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(this_07);
            ExtractUnpivotColumnName(child_binder,pPVar20,&local_298);
            if (local_298.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_298.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
              pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator*(this_07);
              local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_338,
                         "UNPIVOT clause must contain exactly one column - expression \"%s\" does not contain any"
                         ,"");
              pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(this_07);
              (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[8])(&local_88,pPVar22);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar36,pPVar20,&local_338.alias,&local_88);
              __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (0x20 < (ulong)((long)local_298.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_298.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
              pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator*(this_07);
              local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_338,
                         "UNPIVOT clause must contain exactly one column - expression \"%s\" contains multiple (%s)"
                         ,"");
              pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(this_07);
              (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[8])(&local_a8,pPVar22);
              local_1c8.type_._0_8_ =
                   &local_1c8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,", ","");
              StringUtil::Join(&local_c8,&local_298,(string *)&local_1c8);
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (pBVar36,pPVar20,&local_338.alias,&local_a8,&local_c8);
              __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&local_298,0);
            local_338.alias._M_dataplus._M_p = (pointer)&local_100;
            ::std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_100,pvVar21,&local_338);
            pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&local_298,0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pUVar26->column_names,pvVar21);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_298);
            this_07 = this_07 + 1;
          } while (this_07 != puVar4);
        }
        pUVar26 = local_2e0 + 1;
      } while (pUVar26 != local_2a0);
      local_238.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_08._M_head_impl =
           (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *
             )&local_2a8->_M_dataplus)->_M_t).
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      _Var5._M_head_impl =
           (((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)((long)local_2a8 + 8))->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      if (this_08._M_head_impl != _Var5._M_head_impl) {
        do {
          pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)this_08._M_head_impl);
          if ((pPVar22->super_BaseExpression).type != COLUMN_REF) {
            pIVar35 = (InternalException *)__cxa_allocate_exception(0x10);
            local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_338,"Unexpected child of pivot source - not a ColumnRef","")
            ;
            InternalException::InternalException(pIVar35,&local_338.alias);
            __cxa_throw(pIVar35,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)this_08._M_head_impl)->super_BaseExpression;
          pCVar23 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
          __k = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar23);
          __it = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&local_100,__k);
          if (__it.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)this_08._M_head_impl);
            (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[7])(&local_338,pPVar22);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_238,&local_338.alias);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
              operator_delete(local_338.alias._M_dataplus._M_p);
            }
            pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2d0);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&pSVar19->select_list,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)this_08._M_head_impl);
          }
          else {
            pmVar24 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_68,__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar24);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_100,
                    (const_iterator)
                    __it.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur);
          }
          this_08._M_head_impl = (ParsedExpression *)((long)this_08._M_head_impl + 8);
        } while (this_08._M_head_impl != _Var5._M_head_impl);
      }
      lVar38 = local_f0;
      if ((lStack_e8 != 0) && (local_f0 != 0)) {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "Column \"%s\" referenced in UNPIVOT but no matching entry was found in the table"
                   ,"");
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        lVar10 = *(long *)(lVar38 + 8);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,lVar10,*(long *)(lVar38 + 0x10) + lVar10);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar36,local_2e8,&local_338.alias,&local_120);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_208 = (pointer)0x0;
      pVStack_200 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      local_2e0 = local_2c8.
                  super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      pUVar26 = local_2c8.
                super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_2c8.super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pUVar39 = local_2c8.
                  super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
          local_338.alias._M_string_length = 0;
          local_338.alias.field_2._M_allocated_capacity =
               local_338.alias.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if ((pUVar39->expressions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (pUVar39->expressions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            sVar40 = 0;
            do {
              pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[](&pUVar39->column_names,sVar40);
              iVar25 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&local_68,pvVar21);
              if (iVar25.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                pIVar35 = (InternalException *)__cxa_allocate_exception(0x10);
                local_1c8.type_._0_8_ =
                     &local_1c8.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1c8,"Unpivot - could not find column name in name map",
                           "");
                InternalException::InternalException(pIVar35,(string *)&local_1c8);
                __cxa_throw(pIVar35,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              if (local_338.alias._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&local_338);
              }
              ::std::__cxx11::string::_M_append
                        ((char *)&local_338,
                         *(ulong *)((long)iVar25.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                          ._M_cur + 0x28));
              sVar40 = sVar40 + 1;
            } while (sVar40 < (ulong)((long)(pUVar39->expressions).
                                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pUVar39->expressions).
                                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          pUVar26 = pUVar39;
          if ((pUVar39->alias)._M_string_length == 0) {
            pUVar26 = &local_338;
          }
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_208,
                     &pUVar26->alias);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
            operator_delete(local_338.alias._M_dataplus._M_p);
          }
          pUVar39 = pUVar39 + 1;
          pUVar26 = local_2c8.
                    super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (pUVar39 != local_2e0);
      }
      local_278.
      super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.
      super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.
      super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (1 < (ulong)(((long)pUVar26 -
                       (long)local_2c8.
                             super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333))
      {
        __n_02 = 1;
        do {
          pvVar27 = vector<duckdb::UnpivotEntry,_true>::operator[]
                              ((vector<duckdb::UnpivotEntry,_true> *)&local_2c8,__n_02);
          puVar6 = (pvVar27->expressions).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar7 = (pvVar27->expressions).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar27 = vector<duckdb::UnpivotEntry,_true>::operator[]
                              ((vector<duckdb::UnpivotEntry,_true> *)&local_2c8,0);
          if ((long)puVar7 - (long)puVar6 !=
              (long)(pvVar27->expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar27->expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
            pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
            local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_338,
                       "UNPIVOT value count mismatch - entry has %llu values, but expected all entries to have %llu values"
                       ,"");
            pvVar27 = vector<duckdb::UnpivotEntry,_true>::operator[]
                                ((vector<duckdb::UnpivotEntry,_true> *)&local_2c8,__n_02);
            puVar6 = (pvVar27->expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar7 = (pvVar27->expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar27 = vector<duckdb::UnpivotEntry,_true>::operator[]
                                ((vector<duckdb::UnpivotEntry,_true> *)&local_2c8,0);
            BinderException::BinderException<unsigned_long,unsigned_long>
                      (pBVar36,local_2e8,&local_338.alias,(long)puVar7 - (long)puVar6 >> 3,
                       (long)(pvVar27->expressions).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar27->expressions).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
            __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          __n_02 = __n_02 + 1;
        } while (__n_02 < (ulong)(((long)local_2c8.
                                         super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2c8.
                                         super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x3333333333333333));
      }
      for (__n = 0; pvVar27 = vector<duckdb::UnpivotEntry,_true>::operator[]
                                        ((vector<duckdb::UnpivotEntry,_true> *)&local_2c8,0),
          __n < (ulong)((long)(pvVar27->expressions).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar27->expressions).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
        local_338.alias._M_dataplus._M_p = (pointer)0x0;
        local_338.alias._M_string_length = 0;
        local_338.alias.field_2._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::reserve((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_338,
                  ((long)local_2c8.
                         super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2c8.
                         super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
        pUVar26 = local_2c8.
                  super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pUVar39 = local_2c8.
                       super__Vector_base<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pUVar39 != pUVar26;
            pUVar39 = pUVar39 + 1) {
          __args = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::operator[](&pUVar39->expressions,__n);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&local_338,__args);
        }
        ::std::
        vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
        ::
        emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
                    *)&local_278,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&local_338);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_338);
      }
      local_2a8 = local_238.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_220 = local_238.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_168 = local_278.
                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_2a0 = (pointer)local_278.
                           super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      paVar37 = &local_338.alias.field_2;
      local_338.alias._M_dataplus._M_p = (pointer)paVar37;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"unpivot_names","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                 &local_338.alias);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.alias._M_dataplus._M_p != paVar37) {
        operator_delete(local_338.alias._M_dataplus._M_p);
      }
      if (local_278.
          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pp_Var13 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                   &local_1c8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
        uVar43 = 0;
        do {
          if (uVar43 == 0) {
            local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_338,"unpivot_list","");
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_238,&local_338.alias);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
              operator_delete(local_338.alias._M_dataplus._M_p);
            }
            uVar43 = 1;
          }
          else {
            __val = uVar43 + 1;
            cVar42 = '\x01';
            if (8 < uVar43) {
              uVar43 = __val;
              cVar17 = '\x04';
              do {
                cVar42 = cVar17;
                if (uVar43 < 100) {
                  cVar42 = cVar42 + -2;
                  goto LAB_0070b3d2;
                }
                if (uVar43 < 1000) {
                  cVar42 = cVar42 + -1;
                  goto LAB_0070b3d2;
                }
                if (uVar43 < 10000) goto LAB_0070b3d2;
                bVar11 = 99999 < uVar43;
                uVar43 = uVar43 / 10000;
                cVar17 = cVar42 + '\x04';
              } while (bVar11);
              cVar42 = cVar42 + '\x01';
            }
LAB_0070b3d2:
            local_1c8.type_._0_8_ = pp_Var13;
            ::std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar42);
            ::std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_1c8.type_._0_8_,
                       (uint)local_1c8.type_.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,__val);
            plVar28 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_1c8,0,(char *)0x0,0x1360ead);
            local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
            paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar28 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar28 == paVar37) {
              local_338.alias.field_2._M_allocated_capacity = paVar37->_M_allocated_capacity;
              local_338.alias.field_2._8_8_ = plVar28[3];
            }
            else {
              local_338.alias.field_2._M_allocated_capacity = paVar37->_M_allocated_capacity;
              local_338.alias._M_dataplus._M_p = (pointer)*plVar28;
            }
            local_338.alias._M_string_length = plVar28[1];
            *plVar28 = (long)paVar37;
            plVar28[1] = 0;
            *(undefined1 *)(plVar28 + 2) = 0;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_238,&local_338.alias);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
              operator_delete(local_338.alias._M_dataplus._M_p);
            }
            uVar43 = __val;
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1c8.type_._0_8_ != pp_Var13) {
              operator_delete((void *)local_1c8.type_._0_8_);
            }
          }
        } while (uVar43 < (ulong)(((long)local_278.
                                         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_278.
                                         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      QueryResult::DeduplicateColumns(&local_238);
      LogicalType::LogicalType((LogicalType *)&local_338,VARCHAR);
      local_138.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_208;
      local_138.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_200;
      local_138.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1f8;
      local_208 = (pointer)0x0;
      pVStack_200 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      Value::LIST(&local_1c8,(LogicalType *)&local_338,&local_138);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_138);
      LogicalType::~LogicalType((LogicalType *)&local_338);
      this_01 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)&local_338,&local_1c8);
      ConstantExpression::ConstantExpression(this_01,(Value *)&local_338);
      sVar40 = (long)local_220 - (long)local_2a8 >> 5;
      local_240._M_head_impl = this_01;
      Value::~Value((Value *)&local_338);
      local_2e0 = (pointer)sVar40;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[](&local_238,sVar40);
      pCVar29 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                              *)&local_240);
      ::std::__cxx11::string::_M_assign
                ((string *)&(pCVar29->super_ParsedExpression).super_BaseExpression.alias);
      pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_2d0);
      local_338.alias._M_dataplus._M_p = (pointer)local_240._M_head_impl;
      local_240._M_head_impl = (ConstantExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar19->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_338);
      if ((ConstantExpression *)local_338.alias._M_dataplus._M_p != (ConstantExpression *)0x0) {
        (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
      }
      pUVar26 = local_2e0;
      if ((long)(*(long *)((long)&local_2e8[1].alias.field_2 + 8) -
                local_2e8[1].alias.field_2._M_allocated_capacity) >> 5 !=
          ((long)local_278.
                 super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.
                 super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
        pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
        local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "UNPIVOT name count mismatch - got %d names but %d expressions","");
        BinderException::BinderException<unsigned_long,unsigned_long>
                  (pBVar36,local_2e8,&local_338.alias,
                   (long)(*(long *)((long)&local_2e8[1].alias.field_2 + 8) -
                         local_2e8[1].alias.field_2._M_allocated_capacity) >> 5,
                   ((long)local_278.
                          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_278.
                          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
        __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_278.
          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          args_1 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                   ::operator[]((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                                 *)&local_278,__n_00);
          make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                    ((duckdb *)&local_338,(char (*) [13])"unpivot_list",args_1);
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[](&local_238,(long)pUVar26 + 1U + __n_00);
          pFVar30 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                    ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                                  *)&local_338);
          ::std::__cxx11::string::_M_assign
                    ((string *)&(pFVar30->super_ParsedExpression).super_BaseExpression.alias);
          pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                    operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                *)&local_2d0);
          local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_338.alias._M_dataplus._M_p;
          local_338.alias._M_dataplus._M_p = (pointer)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar19->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_298);
          if ((ConstantExpression *)
              local_298.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (ConstantExpression *)0x0) {
            (*(((ParsedExpression *)
               &(local_298.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->super_BaseExpression).
              _vptr_BaseExpression[1])();
          }
          if ((ConstantExpression *)local_338.alias._M_dataplus._M_p != (ConstantExpression *)0x0) {
            (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)(((long)local_278.
                                         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_278.
                                         super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      paVar37 = &local_338.alias.field_2;
      pSVar18 = (SelectNode *)operator_new(0xf0);
      SelectNode::SelectNode(pSVar18);
      ((QueryNode *)
      local_2d8._M_t.
      super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
      super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl)->_vptr_QueryNode =
           (_func_int **)pSVar18;
      local_218._M_head_impl = (ParsedExpression *)operator_new(0x80);
      _Var14._M_head_impl = local_2d0._M_head_impl;
      *(undefined1 *)&((pointer)local_218._M_head_impl)->_M_string_length = 1;
      (((pointer)local_218._M_head_impl)->field_2)._M_allocated_capacity = 0;
      *(undefined8 *)((long)&((pointer)local_218._M_head_impl)->field_2 + 8) = 0;
      (((pointer)((long)local_218._M_head_impl + 0x20))->_M_dataplus)._M_p =
           (pointer)&((pointer)((long)local_218._M_head_impl + 0x40))->field_2;
      ((pointer)((long)local_218._M_head_impl + 0x20))->_M_string_length = 1;
      (((pointer)((long)local_218._M_head_impl + 0x20))->field_2)._M_allocated_capacity = 0;
      *(undefined8 *)((long)&((pointer)((long)local_218._M_head_impl + 0x20))->field_2 + 8) = 0;
      *(undefined4 *)&(((pointer)((long)local_218._M_head_impl + 0x40))->_M_dataplus)._M_p =
           0x3f800000;
      ((pointer)((long)local_218._M_head_impl + 0x40))->_M_string_length = 0;
      (((pointer)((long)local_218._M_head_impl + 0x40))->field_2)._M_allocated_capacity = 0;
      *(size_type **)((long)&((pointer)((long)local_218._M_head_impl + 0x40))->field_2 + 8) =
           &((pointer)((long)local_218._M_head_impl + 0x60))->_M_string_length;
      (((pointer)((long)local_218._M_head_impl + 0x60))->_M_dataplus)._M_p = (pointer)0x0;
      *(undefined1 *)&((pointer)((long)local_218._M_head_impl + 0x60))->_M_string_length = 0;
      (((pointer)local_218._M_head_impl)->_M_dataplus)._M_p =
           (pointer)&PTR__SelectStatement_01981db8;
      *(undefined8 *)((long)&((pointer)((long)local_218._M_head_impl + 0x60))->field_2 + 8) = 0;
      local_2d0._M_head_impl = (QueryNode *)0x0;
      pSVar31 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                              *)&local_218);
      _Var8._M_head_impl =
           (pSVar31->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar31->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var14._M_head_impl;
      if (_Var8._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var8._M_head_impl)->_vptr_QueryNode + 8))();
      }
      this_02 = (SubqueryRef *)operator_new(0x70);
      local_298.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_218._M_head_impl;
      local_218._M_head_impl = (ParsedExpression *)0x0;
      local_338.alias._M_string_length = 0;
      local_338.alias.field_2._M_allocated_capacity =
           local_338.alias.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_338.alias._M_dataplus._M_p = (pointer)paVar37;
      SubqueryRef::SubqueryRef
                (this_02,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)&local_298,&local_338.alias);
      local_248._M_head_impl = this_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.alias._M_dataplus._M_p != paVar37) {
        operator_delete(local_338.alias._M_dataplus._M_p);
      }
      if (local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((pointer)
                  ((local_298.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)->_M_string_length
        )();
      }
      pSVar32 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
                operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                            *)&local_248);
      ::std::__cxx11::string::_M_replace
                ((ulong)&(pSVar32->super_TableRef).alias,0,
                 (char *)(pSVar32->super_TableRef).alias._M_string_length,0x1360f06);
      _Var15._M_head_impl = local_248._M_head_impl;
      local_248._M_head_impl = (SubqueryRef *)0x0;
      pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)local_2d8._M_t.
                              super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>
                              .super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl);
      _Var1._M_head_impl =
           (pSVar19->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (pSVar19->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
           &(_Var15._M_head_impl)->super_TableRef;
      if (_Var1._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
      }
      if (local_220 != local_2a8) {
        sVar41 = (long)local_2e0 + (ulong)(local_2e0 == (pointer)0x0);
        sVar40 = 0;
        do {
          pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_238,sVar40);
          paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x50);
          local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
          paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pvVar21->_M_dataplus)._M_p;
          paVar34 = &pvVar21->field_2;
          if (paVar37 == paVar34) {
            local_338.alias.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
            local_338.alias.field_2._8_8_ = *(long *)((long)&pvVar21->field_2 + 8);
          }
          else {
            local_338.alias.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
            local_338.alias._M_dataplus._M_p = (pointer)paVar37;
          }
          local_338.alias._M_string_length = pvVar21->_M_string_length;
          (pvVar21->_M_dataplus)._M_p = (pointer)paVar34;
          pvVar21->_M_string_length = 0;
          (pvVar21->field_2)._M_local_buf[0] = '\0';
          ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)paVar33,&local_338.alias);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
            operator_delete(local_338.alias._M_dataplus._M_p);
          }
          pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                    operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                *)local_2d8._M_t.
                                  super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>
                                  .super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl);
          local_338.alias._M_dataplus._M_p = (pointer)paVar33;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar19->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.alias._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_338.alias._M_dataplus._M_p + 8))();
          }
          sVar40 = sVar40 + 1;
        } while (sVar41 != sVar40);
      }
      paVar37 = &local_338.alias.field_2;
      pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&local_238,(size_type)local_2e0);
      pCVar23 = (ColumnRefExpression *)operator_new(0x50);
      local_338.alias._M_dataplus._M_p = (pvVar21->_M_dataplus)._M_p;
      paVar33 = &pvVar21->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.alias._M_dataplus._M_p == paVar33) {
        local_338.alias.field_2._M_allocated_capacity = paVar33->_M_allocated_capacity;
        local_338.alias.field_2._8_8_ = *(long *)((long)&pvVar21->field_2 + 8);
        local_338.alias._M_dataplus._M_p = (pointer)paVar37;
      }
      else {
        local_338.alias.field_2._M_allocated_capacity = paVar33->_M_allocated_capacity;
      }
      local_338.alias._M_string_length = pvVar21->_M_string_length;
      (pvVar21->_M_dataplus)._M_p = (pointer)paVar33;
      pvVar21->_M_string_length = 0;
      (pvVar21->field_2)._M_local_buf[0] = '\0';
      ColumnRefExpression::ColumnRefExpression(pCVar23,&local_338.alias);
      pvVar16 = local_160;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.alias._M_dataplus._M_p != paVar37) {
        operator_delete(local_338.alias._M_dataplus._M_p);
      }
      local_158.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_338.alias._M_dataplus._M_p = (pointer)pCVar23;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_158,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_338);
      if ((ColumnRefExpression *)local_338.alias._M_dataplus._M_p != (ColumnRefExpression *)0x0) {
        (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
      }
      make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_250,(char (*) [7])0x135de12,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_158);
      pFVar30 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                              *)&local_250);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[](&pvVar16->unpivot_names,0);
      ::std::__cxx11::string::_M_assign
                ((string *)&(pFVar30->super_ParsedExpression).super_BaseExpression.alias);
      pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)local_2d8._M_t.
                              super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>
                              .super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl);
      local_338.alias._M_dataplus._M_p = (pointer)local_250._M_head_impl;
      local_250._M_head_impl = (FunctionExpression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar19->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_338);
      if ((ColumnRefExpression *)local_338.alias._M_dataplus._M_p != (ColumnRefExpression *)0x0) {
        (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
      }
      if (local_2a0 != (pointer)local_168) {
        lVar38 = ((long)local_2a0 - (long)local_168 >> 3) * -0x5555555555555555;
        local_220 = (pointer)&local_2e8[1].alias.field_2;
        ppbVar12 = &local_298.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2a8 = (pointer)&local_2e8->column_name_alias;
        local_2a0 = (pointer)(lVar38 + (ulong)(lVar38 == 0));
        local_2e0 = (pointer)((long)local_2e0 + 1);
        __n_01 = (pointer)0x0;
        do {
          pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_238,
                                 (long)&(__n_01->
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + (long)local_2e0)
          ;
          local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(pvVar21->_M_dataplus)._M_p;
          paVar37 = &pvVar21->field_2;
          if (local_298.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)paVar37) {
            local_298.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)paVar37->_M_allocated_capacity;
            lStack_280 = *(long *)((long)&pvVar21->field_2 + 8);
            local_298.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar12;
          }
          else {
            local_298.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)paVar37->_M_allocated_capacity;
          }
          local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pvVar21->_M_string_length;
          (pvVar21->_M_dataplus)._M_p = (pointer)paVar37;
          pvVar21->_M_string_length = 0;
          (pvVar21->field_2)._M_local_buf[0] = '\0';
          pCVar23 = (ColumnRefExpression *)operator_new(0x50);
          local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
          if (local_298.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)ppbVar12) {
            local_338.alias.field_2._8_8_ = lStack_280;
          }
          else {
            local_338.alias._M_dataplus._M_p =
                 (pointer)local_298.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          }
          local_338.alias.field_2._M_allocated_capacity =
               (size_type)
               local_298.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_338.alias._M_string_length =
               (size_type)
               local_298.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)local_298.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          local_298.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar12;
          ColumnRefExpression::ColumnRefExpression(pCVar23,&local_338.alias);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
            operator_delete(local_338.alias._M_dataplus._M_p);
          }
          local_188.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_188.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_338.alias._M_dataplus._M_p = (pointer)pCVar23;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&local_188,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_338);
          if ((ColumnRefExpression *)local_338.alias._M_dataplus._M_p != (ColumnRefExpression *)0x0)
          {
            (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
          }
          make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                    ((duckdb *)&local_258,(char (*) [7])0x135de12,
                     (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)&local_188);
          this_06 = local_2a8;
          if ((pointer)((long)(local_2e8->column_name_alias).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_2e8->column_name_alias).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n_01) {
            this_06 = local_220;
          }
          pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)this_06,(size_type)__n_01);
          local_1e8 = local_1d8;
          pcVar9 = (pvVar21->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar9,pcVar9 + pvVar21->_M_string_length);
          pFVar30 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                    ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                                  *)&local_258);
          ::std::__cxx11::string::_M_assign
                    ((string *)&(pFVar30->super_ParsedExpression).super_BaseExpression.alias);
          pSVar19 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                    operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                *)local_2d8._M_t.
                                  super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>
                                  .super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl);
          local_338.alias._M_dataplus._M_p = (pointer)local_258._M_head_impl;
          local_258._M_head_impl = (FunctionExpression *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar19->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_338);
          if ((ColumnRefExpression *)local_338.alias._M_dataplus._M_p != (ColumnRefExpression *)0x0)
          {
            (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
          }
          if (*(char *)&local_2e8[2]._vptr_TableRef == '\0') {
            pCVar23 = (ColumnRefExpression *)operator_new(0x50);
            local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_338,local_1e8,local_1e8 + local_1e0);
            ColumnRefExpression::ColumnRefExpression(pCVar23,&local_338.alias);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.alias._M_dataplus._M_p != &local_338.alias.field_2) {
              operator_delete(local_338.alias._M_dataplus._M_p);
            }
            this_03 = (OperatorExpression *)operator_new(0x50);
            local_338.expressions.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_338.alias._M_dataplus._M_p = (pointer)pCVar23;
            OperatorExpression::OperatorExpression
                      (this_03,OPERATOR_IS_NOT_NULL,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_338,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_338.expressions.
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (local_338.expressions.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              (**(code **)((long)((local_338.expressions.
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                 )._M_t.
                                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          + 8))();
            }
            local_338.expressions.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((ColumnRefExpression *)local_338.alias._M_dataplus._M_p !=
                (ColumnRefExpression *)0x0) {
              (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
            }
            pCVar23 = (ColumnRefExpression *)*local_210;
            if (pCVar23 == (ColumnRefExpression *)0x0) {
              *local_210 = (long)this_03;
            }
            else {
              this_04 = (ConjunctionExpression *)operator_new(0x50);
              *local_210 = 0;
              local_338.alias._M_dataplus._M_p = (pointer)pCVar23;
              local_338.expressions.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_03;
              ConjunctionExpression::ConjunctionExpression
                        (this_04,CONJUNCTION_AND,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&local_338,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&local_338.expressions.
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((OperatorExpression *)
                  local_338.expressions.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (OperatorExpression *)0x0) {
                (*(((ParsedExpression *)
                   &(local_338.expressions.
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   )->super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_338.expressions.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((ColumnRefExpression *)local_338.alias._M_dataplus._M_p !=
                  (ColumnRefExpression *)0x0) {
                (**(code **)(*(long *)local_338.alias._M_dataplus._M_p + 8))();
              }
              plVar28 = (long *)*local_210;
              *local_210 = (long)this_04;
              if (plVar28 != (long *)0x0) {
                (**(code **)(*plVar28 + 8))();
              }
            }
          }
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8);
          }
          if (local_258._M_head_impl != (FunctionExpression *)0x0) {
            (*((local_258._M_head_impl)->super_ParsedExpression).super_BaseExpression.
              _vptr_BaseExpression[1])();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::~vector(&local_188);
          if (local_298.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar12) {
            operator_delete(local_298.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          __n_01 = (pointer)((long)&(__n_01->
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
        } while (local_2a0 != (pointer)__n_01);
      }
      if (local_250._M_head_impl != (FunctionExpression *)0x0) {
        (*((local_250._M_head_impl)->super_ParsedExpression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_158);
      if (local_248._M_head_impl != (SubqueryRef *)0x0) {
        (*((local_248._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      }
      if (local_218._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_218._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_240._M_head_impl != (ConstantExpression *)0x0) {
        (*((local_240._M_head_impl)->super_ParsedExpression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      Value::~Value(&local_1c8);
      ::std::
      vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      ::~vector(&local_278);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_208);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_238);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_100);
      ::std::vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>::~vector
                (&local_2c8);
      if (local_2d0._M_head_impl != (QueryNode *)0x0) {
        (*(local_2d0._M_head_impl)->_vptr_QueryNode[1])();
      }
      return (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)
             (_Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>)
             local_2d8._M_t.
             super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
             super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    }
  }
  pBVar36 = (BinderException *)__cxa_allocate_exception(0x10);
  local_338.alias._M_dataplus._M_p = (pointer)&local_338.alias.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,
             "UNPIVOT clause must unpivot on at least one column - zero were provided","");
  BinderException::BinderException<>(pBVar36,local_2e8,&local_338.alias);
  __cxa_throw(pBVar36,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SelectNode> Binder::BindUnpivot(Binder &child_binder, PivotRef &ref,
                                           vector<unique_ptr<ParsedExpression>> all_columns,
                                           unique_ptr<ParsedExpression> &where_clause) {
	D_ASSERT(ref.groups.empty());
	D_ASSERT(ref.pivots.size() == 1);

	auto select_node = make_uniq<SelectNode>();
	select_node->from_table = std::move(ref.source);

	// handle the pivot
	auto &unpivot = ref.pivots[0];

	// handle star expressions in any entries
	vector<UnpivotEntry> unpivot_entries;
	for (auto &entry : unpivot.entries) {
		ExtractUnpivotEntries(child_binder, entry, unpivot_entries);
	}
	if (unpivot_entries.empty()) {
		throw BinderException(ref, "UNPIVOT clause must unpivot on at least one column - zero were provided");
	}

	case_insensitive_set_t handled_columns;
	case_insensitive_map_t<string> name_map;
	for (auto &entry : unpivot_entries) {
		for (auto &unpivot_expr : entry.expressions) {
			vector<string> result;
			ExtractUnpivotColumnName(*unpivot_expr, result);
			if (result.empty()) {

				throw BinderException(
				    *unpivot_expr,
				    "UNPIVOT clause must contain exactly one column - expression \"%s\" does not contain any",
				    unpivot_expr->ToString());
			}
			if (result.size() > 1) {
				throw BinderException(
				    *unpivot_expr,
				    "UNPIVOT clause must contain exactly one column - expression \"%s\" contains multiple (%s)",
				    unpivot_expr->ToString(), StringUtil::Join(result, ", "));
			}
			handled_columns.insert(result[0]);
			entry.column_names.push_back(std::move(result[0]));
		}
	}

	vector<string> select_names;
	for (auto &col_expr : all_columns) {
		if (col_expr->GetExpressionType() != ExpressionType::COLUMN_REF) {
			throw InternalException("Unexpected child of pivot source - not a ColumnRef");
		}
		auto &columnref = col_expr->Cast<ColumnRefExpression>();
		auto &column_name = columnref.GetColumnName();
		auto entry = handled_columns.find(column_name);
		if (entry == handled_columns.end()) {
			// not handled - add to the set of regularly selected columns
			select_names.push_back(col_expr->GetName());
			select_node->select_list.push_back(std::move(col_expr));
		} else {
			name_map[column_name] = column_name;
			handled_columns.erase(entry);
		}
	}
	if (!handled_columns.empty()) {
		for (auto &entry : handled_columns) {
			throw BinderException(
			    ref, "Column \"%s\" referenced in UNPIVOT but no matching entry was found in the table", entry);
		}
	}
	vector<Value> unpivot_names;
	for (auto &entry : unpivot_entries) {
		string generated_name;
		D_ASSERT(entry.expressions.size() == entry.column_names.size());
		for (idx_t c = 0; c < entry.expressions.size(); c++) {
			auto name_entry = name_map.find(entry.column_names[c]);
			if (name_entry == name_map.end()) {
				throw InternalException("Unpivot - could not find column name in name map");
			}
			if (!generated_name.empty()) {
				generated_name += "_";
			}
			generated_name += name_entry->second;
		}
		unpivot_names.emplace_back(!entry.alias.empty() ? entry.alias : generated_name);
	}
	vector<vector<unique_ptr<ParsedExpression>>> unpivot_expressions;
	for (idx_t v_idx = 1; v_idx < unpivot_entries.size(); v_idx++) {
		if (unpivot_entries[v_idx].expressions.size() != unpivot_entries[0].expressions.size()) {
			throw BinderException(
			    ref,
			    "UNPIVOT value count mismatch - entry has %llu values, but expected all entries to have %llu values",
			    unpivot_entries[v_idx].expressions.size(), unpivot_entries[0].expressions.size());
		}
	}

	for (idx_t v_idx = 0; v_idx < unpivot_entries[0].expressions.size(); v_idx++) {
		vector<unique_ptr<ParsedExpression>> expressions;
		expressions.reserve(unpivot_entries.size());
		for (auto &entry : unpivot_entries) {
			expressions.push_back(std::move(entry.expressions[v_idx]));
		}
		unpivot_expressions.push_back(std::move(expressions));
	}

	idx_t column_count = select_names.size();
	idx_t unnest_count = unpivot_expressions.size();
	// add the names for the generated unpivot lists
	select_names.push_back("unpivot_names");
	for (idx_t i = 0; i < unpivot_expressions.size(); i++) {
		if (i > 0) {
			select_names.push_back("unpivot_list_" + std::to_string(i + 1));
		} else {
			select_names.push_back("unpivot_list");
		}
	}

	// now de-duplicate the names
	QueryResult::DeduplicateColumns(select_names);

	// construct the UNNEST expression for the set of names (constant)
	auto unpivot_list = Value::LIST(LogicalType::VARCHAR, std::move(unpivot_names));
	auto unpivot_name_expr = make_uniq<ConstantExpression>(std::move(unpivot_list));
	unpivot_name_expr->alias = select_names[column_count];
	select_node->select_list.push_back(std::move(unpivot_name_expr));

	// construct the unpivot lists for the set of unpivoted columns
	if (ref.unpivot_names.size() != unpivot_expressions.size()) {
		throw BinderException(ref, "UNPIVOT name count mismatch - got %d names but %d expressions",
		                      ref.unpivot_names.size(), unpivot_expressions.size());
	}
	for (idx_t i = 0; i < unpivot_expressions.size(); i++) {
		auto list_expr = make_uniq<FunctionExpression>("unpivot_list", std::move(unpivot_expressions[i]));
		list_expr->alias = select_names[column_count + 1 + i];
		select_node->select_list.push_back(std::move(list_expr));
	}

	// move the unpivot lists into a subquery
	auto result_node = make_uniq<SelectNode>();
	auto sub_select = make_uniq<SelectStatement>();
	sub_select->node = std::move(select_node);
	auto subquery = make_uniq<SubqueryRef>(std::move(sub_select));
	subquery->alias = "unpivot";

	result_node->from_table = std::move(subquery);

	// construct the final UNNEST calls which generate the final unpivot result
	for (idx_t i = 0; i < column_count; i++) {
		auto select_col = make_uniq<ColumnRefExpression>(std::move(select_names[i]));
		result_node->select_list.push_back(std::move(select_col));
	}

	auto unpivot_name_list = make_uniq<ColumnRefExpression>(std::move(select_names[column_count]));
	vector<unique_ptr<ParsedExpression>> unnest_name_children;
	unnest_name_children.push_back(std::move(unpivot_name_list));
	auto unnest_name_expr = make_uniq<FunctionExpression>("unnest", std::move(unnest_name_children));
	unnest_name_expr->SetAlias(unpivot.unpivot_names[0]);
	result_node->select_list.push_back(std::move(unnest_name_expr));

	for (idx_t i = 0; i < unnest_count; i++) {
		auto unpivot_internal_name = std::move(select_names[column_count + 1 + i]);

		auto unpivot_list_ref = make_uniq<ColumnRefExpression>(std::move(unpivot_internal_name));
		vector<unique_ptr<ParsedExpression>> unnest_val_children;
		unnest_val_children.push_back(std::move(unpivot_list_ref));
		auto unnest_val_expr = make_uniq<FunctionExpression>("unnest", std::move(unnest_val_children));
		auto unnest_name = i < ref.column_name_alias.size() ? ref.column_name_alias[i] : ref.unpivot_names[i];
		unnest_val_expr->SetAlias(unnest_name);
		result_node->select_list.push_back(std::move(unnest_val_expr));
		if (!ref.include_nulls) {
			// if we are running with EXCLUDE NULLS we need to add an IS NOT NULL filter
			auto colref = make_uniq<ColumnRefExpression>(unnest_name);
			auto filter = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_IS_NOT_NULL, std::move(colref));
			if (where_clause) {
				where_clause = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND,
				                                                std::move(where_clause), std::move(filter));
			} else {
				where_clause = std::move(filter);
			}
		}
	}
	return result_node;
}